

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O3

void __thiscall BMP::writeMatrix(BMP *this,ofstream *out)

{
  ofstream *poVar1;
  long lVar2;
  char cVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  char local_3a [2];
  ofstream *local_38;
  
  if (0 < (this->headInfo).biWidth) {
    local_38 = out;
    if (out == (ofstream *)0x0) {
      local_38 = (ofstream *)&std::cout;
    }
    lVar7 = 0;
    do {
      if (0 < (this->headInfo).biHeight) {
        lVar5 = 0;
        do {
          lVar2 = std::cout;
          if (out == (ofstream *)0x0) {
            *(undefined8 *)(std::ofstream::close + *(long *)(std::cout + -0x18)) = 3;
            lVar2 = *(long *)(lVar2 + -0x18);
            if (*(char *)(lVar2 + 0x10c1f9) == '\0') {
              std::ios::widen((char)lVar2 + '\x18');
              *(undefined1 *)(lVar2 + 0x10c1f9) = 1;
            }
            *(undefined1 *)(lVar2 + 0x10c1f8) = 0x30;
            poVar4 = (ostream *)
                     std::ostream::operator<<((ostream *)&std::cout,(uint)this->field[lVar7][lVar5])
            ;
            local_3a[1] = 0x20;
            pcVar6 = local_3a + 1;
          }
          else {
            lVar2 = *(long *)out;
            *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = 3;
            lVar2 = *(long *)(lVar2 + -0x18);
            poVar1 = out + lVar2;
            if (out[lVar2 + 0xe1] == (ofstream)0x0) {
              std::ios::widen((char)poVar1);
              poVar1[0xe1] = (ofstream)0x1;
            }
            poVar1[0xe0] = (ofstream)0x30;
            poVar4 = (ostream *)
                     std::ostream::operator<<((ostream *)out,(uint)this->field[lVar7][lVar5]);
            local_3a[0] = ' ';
            pcVar6 = local_3a;
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,1);
          lVar5 = lVar5 + 1;
        } while (lVar5 < (this->headInfo).biHeight);
      }
      cVar3 = (char)local_38;
      std::ios::widen((char)*(undefined8 *)(*(long *)local_38 + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->headInfo).biWidth);
  }
  if (out == (ofstream *)0x0) {
    out = (ofstream *)&std::cout;
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return;
}

Assistant:

void BMP::writeMatrix(  std::ofstream *out  ) {
    using namespace std;
    bool flag;
    if ( out != nullptr ) {
        flag = true;
    } else {
        flag = false;
    }

    for ( auto i = 0; i < headInfo.biWidth; i++ ) {
        for ( auto j = 0; j < headInfo.biHeight; j++ ) {
            if ( flag ) {
                ( *out ) << setw( 3 ) << setfill( '0' ) << (int)field[ i ][ j ] << ' ';
            } else {
                cout << setw( 3 ) << setfill( '0' ) << (int)field[ i ][ j ] << ' ';
            }
        }

        if (flag) {
            (*out) << endl;
        } else {
            cout << endl;
        }
    }

    if (flag) {
        (*out) << endl;
    } else {
        cout << endl;
    }
}